

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

char * xmrig::OclLib::defaultLoader(void)

{
  return "libOpenCL.so";
}

Assistant:

const char *xmrig::OclLib::defaultLoader()
{
#   if defined(__APPLE__)
    return "/System/Library/Frameworks/OpenCL.framework/OpenCL";
#   elif defined(_WIN32)
    return "OpenCL.dll";
#   else
    return "libOpenCL.so";
#   endif
}